

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O0

void __thiscall
wasm::SimplifyLocals<false,_true,_true>::~SimplifyLocals(SimplifyLocals<false,_true,_true> *this)

{
  SimplifyLocals<false,_true,_true> *this_local;
  
  (this->
  super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__SimplifyLocals_0271b540;
  std::vector<wasm::Loop_*,_std::allocator<wasm::Loop_*>_>::~vector(&this->loopsToEnlarge);
  std::vector<wasm::If_*,_std::allocator<wasm::If_*>_>::~vector(&this->ifsToEnlarge);
  std::vector<wasm::Block_*,_std::allocator<wasm::Block_*>_>::~vector(&this->blocksToEnlarge);
  SmallVector<wasm::Expression_*,_10UL>::~SmallVector(&this->expressionStack);
  LocalGetCounter::~LocalGetCounter(&this->getCounter);
  std::
  vector<std::map<unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>,_std::allocator<std::map<unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>_>_>
  ::~vector(&this->ifStack);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::~set
            (&this->unoptimizableBlocks);
  std::
  map<wasm::Name,_std::vector<wasm::SimplifyLocals<false,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_true,_true>::BlockBreak>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::vector<wasm::SimplifyLocals<false,_true,_true>::BlockBreak,_std::allocator<wasm::SimplifyLocals<false,_true,_true>::BlockBreak>_>_>_>_>
  ::~map(&this->blockBreaks);
  std::
  map<unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<false,_true,_true>::SinkableInfo>_>_>
  ::~map(&this->sinkables);
  WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>_>
  ::~WalkerPass(&this->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_true,_true>,_wasm::Visitor<wasm::SimplifyLocals<false,_true,_true>,_void>_>_>
               );
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }